

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImGuiContext *this;
  uint uVar1;
  byte in_SIL;
  uint in_EDI;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffe8;
  
  this = GImGui;
  if ((in_SIL & 1) == 0) {
    uVar1 = (in_EDI ^ 0xffffffff) & GImGui->CurrentItemFlags;
  }
  else {
    uVar1 = in_EDI | GImGui->CurrentItemFlags;
  }
  GImGui->CurrentItemFlags = uVar1;
  ImVector<int>::push_back((ImVector<int> *)this,(int *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}